

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdIOCallback.cpp
# Opt level: O1

uint64 __thiscall libebml::StdIOCallback::getFilePointer(StdIOCallback *this)

{
  if (this->File != (FILE *)0x0) {
    return this->mCurrentPosition;
  }
  __assert_fail("File!=0",
                "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/StdIOCallback.cpp"
                ,0xa2,"virtual uint64 libebml::StdIOCallback::getFilePointer()");
}

Assistant:

uint64 StdIOCallback::getFilePointer()
{
  assert(File!=0);

#if 0
  long Result=ftell(File);
  if(Result<0) {
#if !defined(__GNUC__) || (__GNUC__ > 2)
    stringstream Msg;
    Msg<<"Can't tell the current file pointer position for "<<File;
    throw CRTError(Msg.str());
#endif // GCC2
  }
#endif

  return mCurrentPosition;
}